

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_format.cpp
# Opt level: O3

wstring * ON_std_wstring_format_abi_cxx11_(wstring *__return_storage_ptr__,wchar_t *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ON_wStringBuffer buffer;
  va_list args;
  wchar_t stack_buffer [2048];
  ON_wStringBuffer local_2108;
  __va_list_tag local_20e8;
  undefined1 local_20c8 [16];
  undefined8 local_20b8;
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_20a0;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  undefined8 local_2028;
  wchar_t local_2018 [2050];
  
  if (in_AL != '\0') {
    local_2098 = in_XMM0_Qa;
    local_2088 = in_XMM1_Qa;
    local_2078 = in_XMM2_Qa;
    local_2068 = in_XMM3_Qa;
    local_2058 = in_XMM4_Qa;
    local_2048 = in_XMM5_Qa;
    local_2038 = in_XMM6_Qa;
    local_2028 = in_XMM7_Qa;
  }
  local_20b8 = in_RDX;
  local_20b0 = in_RCX;
  local_20a8 = in_R8;
  local_20a0 = in_R9;
  ON_wStringBuffer::ON_wStringBuffer(&local_2108,local_2018,0x800);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  local_20e8.reg_save_area = local_20c8;
  local_20e8.overflow_arg_area = &buffer.m_buffer_capacity;
  local_20e8.gp_offset = 0x10;
  local_20e8.fp_offset = 0x30;
  iVar1 = ON_wString::FormatVargsIntoBuffer(&local_2108,format,&local_20e8);
  if (0 < iVar1) {
    std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__,(ulong)local_2108.m_buffer);
  }
  ON_wStringBuffer::~ON_wStringBuffer(&local_2108);
  return __return_storage_ptr__;
}

Assistant:

std::wstring ON_VARGS_FUNC_CDECL ON_std_wstring_format(const wchar_t* format, ...) ON_NOEXCEPT
{
  wchar_t stack_buffer[2048];
  ON_wStringBuffer buffer(stack_buffer, sizeof(stack_buffer) / sizeof(stack_buffer[0]));
  int n = 0;
  std::wstring str;

  if (0 != format || 0 != format[0])
  {
    va_list args;
    va_start(args, format);
    n = ON_wString::FormatVargsIntoBuffer(buffer, format, args);
    va_end(args);
  }

  if ( n > 0 )
  {
    // exceptions are swallowed.
    try { str.append(buffer.m_buffer, n); }
    catch (const std::exception& ) {}
  }

  return str;
}